

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O1

PyObject * libxml_xmlAttributePtrWrap(xmlAttributePtr attr)

{
  PyObject *pPVar1;
  
  if (attr != (xmlAttributePtr)0x0) {
    pPVar1 = (PyObject *)PyCapsule_New(attr,"xmlAttributePtr",0);
    return pPVar1;
  }
  __Py_NoneStruct = __Py_NoneStruct + 1;
  return (PyObject *)&_Py_NoneStruct;
}

Assistant:

PyObject *
libxml_xmlAttributePtrWrap(xmlAttributePtr attr)
{
    PyObject *ret;

    if (attr == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    ret = PyCapsule_New((void *) attr, (char *) "xmlAttributePtr", NULL);
    return (ret);
}